

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int tag_size,uint32 tag,CodedInputStream *input,RepeatedField<int> *value)

{
  bool bVar1;
  byte *pbVar2;
  int iVar3;
  int value_1;
  uint32 temp_1;
  uint32 temp;
  uint32 local_3c;
  uint32 local_38;
  uint32 local_34;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_34);
  if (bVar1) {
    local_3c = local_34;
    RepeatedField<int>::Add(value,(int *)&local_3c);
    for (iVar3 = value->total_size_ - value->current_size_; bVar1 = true, 0 < iVar3;
        iVar3 = iVar3 + -1) {
      if (tag < 0x80) {
        pbVar2 = input->buffer_;
        if (input->buffer_end_ <= pbVar2) {
          return true;
        }
        if (*pbVar2 != tag) {
          return true;
        }
        pbVar2 = pbVar2 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pbVar2 < 2) {
          return true;
        }
        if ((tag & 0xff | 0x80) != (uint)*pbVar2) {
          return true;
        }
        if (tag >> 7 != (uint)pbVar2[1]) {
          return true;
        }
        pbVar2 = pbVar2 + 2;
      }
      input->buffer_ = pbVar2;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_38);
      if (!bVar1) goto LAB_001fcf29;
      local_3c = local_38;
      RepeatedField<int>::AddAlreadyReserved(value,(int *)&local_3c);
    }
  }
  else {
LAB_001fcf29:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadRepeatedPrimitiveNoInline(
    int tag_size,
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* value) {
  return ReadRepeatedPrimitive<CType, DeclaredType>(
      tag_size, tag, input, value);
}